

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O1

void stbir__calculate_filters
               (stbir__contributors *contributors,float *coefficients,stbir_filter filter,
               float scale_ratio,float shift,int input_size,int output_size)

{
  stbir__support_fn *psVar1;
  stbir__kernel_fn *psVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  long lVar7;
  stbir__contributors *psVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  float fVar22;
  
  uVar9 = output_size;
  if (scale_ratio <= 1.0) {
    iVar4 = stbir__get_filter_pixel_width(filter,scale_ratio);
    uVar9 = (iVar4 - (iVar4 >> 0x1f) & 0xfffffffeU) + input_size;
  }
  psVar1 = stbir__filter_info_table[filter].support;
  if (1.0 < scale_ratio) {
    fVar18 = 1.0 / scale_ratio;
    fVar17 = (*psVar1)(fVar18);
    if (0 < (int)uVar9) {
      uVar10 = 0;
      do {
        fVar22 = (float)(int)uVar10 + 0.5;
        dVar21 = floor((double)(((fVar22 - fVar17 * scale_ratio) + shift) / scale_ratio) + 0.5);
        iVar4 = (int)dVar21;
        dVar21 = floor((double)((fVar17 * scale_ratio + fVar22 + shift) / scale_ratio) + -0.5);
        iVar5 = (int)dVar21;
        fVar19 = (*psVar1)((float)(~-(uint)(scale_ratio <= 1.0) & (uint)fVar18 |
                                  -(uint)(scale_ratio <= 1.0) & (uint)scale_ratio));
        fVar19 = ceilf(fVar19 + fVar19);
        uVar14 = iVar5 - iVar4;
        fVar20 = (*stbir__filter_info_table[filter].support)(fVar18);
        fVar20 = ceilf(fVar20 + fVar20);
        if ((int)fVar20 < (int)uVar14) {
          __assert_fail("in_last_pixel - in_first_pixel <= (int)ceil(stbir__filter_info_table[filter].support(1/scale) * 2)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x414,
                        "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        contributors[uVar10].n0 = iVar4;
        contributors[uVar10].n1 = iVar5;
        if (iVar5 < iVar4) {
          __assert_fail("contributor->n1 >= contributor->n0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x419,
                        "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        fVar20 = (fVar22 + shift) / scale_ratio;
        iVar16 = (int)fVar19 * (int)uVar10;
        if ((int)uVar14 < 0) {
          fVar19 = 0.0;
        }
        else {
          psVar2 = stbir__filter_info_table[filter].kernel;
          fVar19 = 0.0;
          iVar11 = 0;
          do {
            fVar22 = (*psVar2)(fVar20 - ((float)(iVar11 + iVar4) + 0.5),fVar18);
            coefficients[(long)iVar16 + (long)iVar11] = fVar22;
            if (((iVar11 != 0) || (fVar22 != 0.0)) || (NAN(fVar22))) {
              fVar19 = fVar19 + fVar22;
              iVar11 = iVar11 + 1;
            }
            else {
              iVar4 = iVar4 + 1;
              contributors[uVar10].n0 = iVar4;
              iVar11 = 0;
            }
            uVar14 = iVar5 - iVar4;
          } while (iVar11 <= (int)uVar14);
        }
        fVar20 = (*stbir__filter_info_table[filter].kernel)
                           (((float)(iVar5 + 1) + 0.5) - fVar20,fVar18);
        if ((fVar20 != 0.0) || (NAN(fVar20))) {
          __assert_fail("stbir__filter_info_table[filter].kernel((float)(in_last_pixel + 1) + 0.5f - in_center_of_out, 1/scale) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x42b,
                        "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        if (fVar19 <= 0.9) {
          __assert_fail("total_filter > 0.9",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x42d,
                        "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        if (1.1 <= fVar19) {
          __assert_fail("total_filter < 1.1f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x42e,
                        "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        if (-1 < (int)uVar14) {
          uVar12 = 0;
          do {
            coefficients[(long)iVar16 + uVar12] =
                 coefficients[(long)iVar16 + uVar12] * (1.0 / fVar19);
            uVar12 = uVar12 + 1;
          } while (uVar14 + 1 != uVar12);
        }
        if (-1 < (int)uVar14) {
          uVar12 = (ulong)uVar14;
          do {
            if ((coefficients[(long)iVar16 + uVar12] != 0.0) ||
               (NAN(coefficients[(long)iVar16 + uVar12]))) break;
            contributors[uVar10].n1 = contributors[uVar10].n0 + (int)(uVar12 - 1);
            bVar3 = 0 < (long)uVar12;
            uVar12 = uVar12 - 1;
          } while (bVar3);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9);
    }
  }
  else {
    fVar17 = (*psVar1)(scale_ratio);
    if (0 < (int)uVar9) {
      fVar18 = -shift;
      uVar10 = 0;
      do {
        iVar4 = stbir__get_filter_pixel_width(filter,scale_ratio);
        iVar5 = (int)uVar10;
        fVar22 = (float)(iVar5 - iVar4 / 2) + 0.5;
        dVar21 = floor((double)((fVar22 - fVar17 / scale_ratio) * scale_ratio + fVar18) + 0.5);
        iVar4 = (int)dVar21;
        dVar21 = floor((double)((fVar17 / scale_ratio + fVar22) * scale_ratio + fVar18) + -0.5);
        iVar16 = (int)dVar21;
        fVar19 = (*psVar1)((float)(-(uint)(scale_ratio <= 1.0) & (uint)scale_ratio |
                                  ~-(uint)(scale_ratio <= 1.0) & (uint)(1.0 / scale_ratio)));
        fVar19 = ceilf(fVar19 + fVar19);
        uVar14 = iVar16 - iVar4;
        fVar20 = (*stbir__filter_info_table[filter].support)(scale_ratio);
        fVar20 = ceilf(fVar20 + fVar20);
        if ((int)fVar20 < (int)uVar14) {
          __assert_fail("out_last_pixel - out_first_pixel <= (int)ceil(stbir__filter_info_table[filter].support(scale_ratio) * 2)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x444,
                        "void stbir__calculate_coefficients_downsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        contributors[uVar10].n0 = iVar4;
        contributors[uVar10].n1 = iVar16;
        if (iVar16 < iVar4) {
          __assert_fail("contributor->n1 >= contributor->n0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x449,
                        "void stbir__calculate_coefficients_downsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        fVar20 = fVar22 * scale_ratio + fVar18;
        if (-1 < (int)uVar14) {
          psVar2 = stbir__filter_info_table[filter].kernel;
          uVar12 = 0;
          do {
            fVar22 = (*psVar2)(((float)(iVar4 + (int)uVar12) + 0.5) - fVar20,scale_ratio);
            coefficients[(long)((int)fVar19 * iVar5) + uVar12] = fVar22 * scale_ratio;
            uVar12 = uVar12 + 1;
          } while ((iVar16 - iVar4) + 1 != uVar12);
        }
        fVar20 = (*stbir__filter_info_table[filter].kernel)
                           (((float)(iVar16 + 1) + 0.5) - fVar20,scale_ratio);
        if ((fVar20 != 0.0) || (NAN(fVar20))) {
          __assert_fail("stbir__filter_info_table[filter].kernel((float)(out_last_pixel + 1) + 0.5f - out_center_of_in, scale_ratio) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x452,
                        "void stbir__calculate_coefficients_downsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        if (-1 < (int)uVar14) {
          iVar4 = (iVar16 - iVar4) + 1;
          pfVar6 = coefficients + (long)((int)fVar19 * iVar5) + (ulong)uVar14;
          do {
            if ((*pfVar6 != 0.0) || (NAN(*pfVar6))) break;
            contributors[uVar10].n1 = contributors[uVar10].n0 + iVar4 + -2;
            iVar4 = iVar4 + -1;
            pfVar6 = pfVar6 + -1;
          } while (0 < iVar4);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9);
    }
    uVar9 = output_size;
    if (scale_ratio <= 1.0) {
      iVar4 = stbir__get_filter_pixel_width(filter,scale_ratio);
      uVar9 = (iVar4 - (iVar4 >> 0x1f) & 0xfffffffeU) + input_size;
    }
    uVar10 = (ulong)uVar9;
    fVar17 = (float)(-(uint)(scale_ratio <= 1.0) & (uint)scale_ratio |
                    ~-(uint)(scale_ratio <= 1.0) & (uint)(1.0 / scale_ratio));
    fVar18 = (*psVar1)(fVar17);
    fVar18 = ceilf(fVar18 + fVar18);
    if (0 < output_size) {
      iVar4 = 0;
      do {
        fVar19 = 0.0;
        if (0 < (int)uVar9) {
          uVar12 = 0;
          do {
            iVar5 = contributors[uVar12].n0;
            if (iVar4 < iVar5) break;
            if (iVar4 <= contributors[uVar12].n1) {
              fVar20 = (*psVar1)(fVar17);
              fVar20 = ceilf(fVar20 + fVar20);
              fVar19 = fVar19 + coefficients[(iVar4 - iVar5) + (int)uVar12 * (int)fVar20];
            }
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
        }
        if (fVar19 <= 0.9) {
          __assert_fail("total > 0.9f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x475,
                        "void stbir__normalize_downsample_coefficients(stbir__contributors *, float *, stbir_filter, float, int, int)"
                       );
        }
        if (1.1 <= fVar19) {
          __assert_fail("total < 1.1f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x476,
                        "void stbir__normalize_downsample_coefficients(stbir__contributors *, float *, stbir_filter, float, int, int)"
                       );
        }
        if ((0 < (int)uVar9) && (iVar5 = contributors->n0, iVar5 <= iVar4)) {
          uVar14 = 0;
          psVar8 = contributors;
          do {
            if (iVar4 <= psVar8->n1) {
              fVar20 = (*psVar1)(fVar17);
              fVar20 = ceilf(fVar20 + fVar20);
              iVar5 = (int)fVar20 * uVar14 + (iVar4 - iVar5);
              coefficients[iVar5] = coefficients[iVar5] * (1.0 / fVar19);
            }
            uVar14 = uVar14 + 1;
            if ((int)uVar9 <= (int)uVar14) break;
            psVar8 = contributors + uVar14;
            iVar5 = psVar8->n0;
          } while (iVar5 <= iVar4);
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != output_size);
    }
    if (0 < (int)uVar9) {
      iVar4 = (int)fVar18;
      uVar12 = 0;
      do {
        iVar5 = -1;
        lVar13 = 0;
        do {
          lVar7 = lVar13;
          fVar18 = (*psVar1)(fVar17);
          fVar18 = ceilf(fVar18 + fVar18);
          iVar16 = (int)uVar12;
          iVar5 = iVar5 + 1;
          lVar13 = lVar7 + 1;
        } while (coefficients[(int)fVar18 * iVar16 + lVar7] == 0.0);
        iVar11 = contributors[uVar12].n0;
        iVar15 = iVar5 + iVar11;
        if (iVar5 + iVar11 < 1) {
          iVar15 = 0;
        }
        iVar5 = contributors[uVar12].n1;
        contributors[uVar12].n0 = iVar15;
        iVar15 = (iVar5 - iVar15) + 1;
        if (iVar4 < iVar15) {
          iVar15 = iVar4;
        }
        fVar18 = (*psVar1)(fVar17);
        fVar18 = ceilf(fVar18 + fVar18);
        if (0 < iVar15) {
          iVar15 = (int)lVar7 + iVar11;
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          iVar5 = (iVar5 - iVar15) + 1;
          if (iVar4 < iVar5) {
            iVar5 = iVar4;
          }
          lVar13 = 0;
          do {
            if ((int)fVar18 <= (iVar15 - iVar11) + (int)lVar13) break;
            fVar19 = (*psVar1)(fVar17);
            fVar19 = ceilf(fVar19 + fVar19);
            fVar19 = coefficients[(long)((int)fVar19 * iVar16) + (iVar15 - iVar11) + lVar13];
            fVar20 = (*psVar1)(fVar17);
            fVar20 = ceilf(fVar20 + fVar20);
            coefficients[(int)fVar20 * iVar16 + lVar13] = fVar19;
            lVar13 = lVar13 + 1;
          } while (iVar5 != (int)lVar13);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar10);
      if (0 < (int)uVar9) {
        uVar12 = 0;
        do {
          iVar4 = contributors[uVar12].n1;
          if (output_size + -1 <= contributors[uVar12].n1) {
            iVar4 = output_size + -1;
          }
          contributors[uVar12].n1 = iVar4;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
    }
  }
  return;
}

Assistant:

static void stbir__calculate_filters(stbir__contributors* contributors, float* coefficients, stbir_filter filter, float scale_ratio, float shift, int input_size, int output_size)
{
    int n;
    int total_contributors = stbir__get_contributors(scale_ratio, filter, input_size, output_size);

    if (stbir__use_upsampling(scale_ratio))
    {
        float out_pixels_radius = stbir__filter_info_table[filter].support(1 / scale_ratio) * scale_ratio;

        // Looping through out pixels
        for (n = 0; n < total_contributors; n++)
        {
            float in_center_of_out; // Center of the current out pixel in the in pixel space
            int in_first_pixel, in_last_pixel;

            stbir__calculate_sample_range_upsample(n, out_pixels_radius, scale_ratio, shift, &in_first_pixel, &in_last_pixel, &in_center_of_out);

            stbir__calculate_coefficients_upsample(filter, scale_ratio, in_first_pixel, in_last_pixel, in_center_of_out, stbir__get_contributor(contributors, n), stbir__get_coefficient(coefficients, filter, scale_ratio, n, 0));
        }
    }
    else
    {
        float in_pixels_radius = stbir__filter_info_table[filter].support(scale_ratio) / scale_ratio;

        // Looping through in pixels
        for (n = 0; n < total_contributors; n++)
        {
            float out_center_of_in; // Center of the current out pixel in the in pixel space
            int out_first_pixel, out_last_pixel;
            int n_adjusted = n - stbir__get_filter_pixel_margin(filter, scale_ratio);

            stbir__calculate_sample_range_downsample(n_adjusted, in_pixels_radius, scale_ratio, shift, &out_first_pixel, &out_last_pixel, &out_center_of_in);

            stbir__calculate_coefficients_downsample(filter, scale_ratio, out_first_pixel, out_last_pixel, out_center_of_in, stbir__get_contributor(contributors, n), stbir__get_coefficient(coefficients, filter, scale_ratio, n, 0));
        }

        stbir__normalize_downsample_coefficients(contributors, coefficients, filter, scale_ratio, input_size, output_size);
    }
}